

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdLocal.c
# Opt level: O0

DdNode * Extra_dsdRemap(DdManager *dd,DdNode *bF,st__table *pCache,int *pVar2Form,int *pForm2Var,
                       DdNode **pbCube0,DdNode **pbCube1)

{
  int iVar1;
  DdManager *pDStack_70;
  int iForm;
  DdNode *bRes;
  DdNode *bRes1;
  DdNode *bRes0;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *bFR;
  DdNode **pbCube0_local;
  int *pForm2Var_local;
  int *pVar2Form_local;
  st__table *pCache_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  bF0 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  dd_local = (DdManager *)bF;
  if (bF0->index != 0x7fffffff) {
    bFR = (DdNode *)pbCube0;
    pbCube0_local = (DdNode **)pForm2Var;
    pForm2Var_local = pVar2Form;
    pVar2Form_local = (int *)pCache;
    pCache_local = (st__table *)bF;
    bF_local = &dd->sentinel;
    if ((bF0->ref == 1) ||
       (iVar1 = st__lookup(pCache,(char *)bF,(char **)&stack0xffffffffffffff90), iVar1 == 0)) {
      iVar1 = pForm2Var_local[bF0->index];
      bF1 = Extra_bddNodePointedByCube
                      ((DdManager *)bF_local,(DdNode *)pCache_local,
                       *(DdNode **)(&bFR->index + (long)iVar1 * 2));
      bRes0 = Extra_bddNodePointedByCube
                        ((DdManager *)bF_local,(DdNode *)pCache_local,pbCube1[iVar1]);
      bRes1 = Extra_dsdRemap((DdManager *)bF_local,bF1,(st__table *)pVar2Form_local,pForm2Var_local,
                             (int *)pbCube0_local,(DdNode **)bFR,pbCube1);
      Cudd_Ref(bRes1);
      bRes = Extra_dsdRemap((DdManager *)bF_local,bRes0,(st__table *)pVar2Form_local,pForm2Var_local
                            ,(int *)pbCube0_local,(DdNode **)bFR,pbCube1);
      Cudd_Ref(bRes);
      pDStack_70 = (DdManager *)
                   Cudd_bddIte((DdManager *)bF_local,
                               *(DdNode **)
                                (&(bF_local[8].type.kids.E)->index +
                                (long)*(int *)((long)pbCube0_local + (long)iVar1 * 4) * 2),bRes,
                               bRes1);
      Cudd_Ref((DdNode *)pDStack_70);
      Cudd_RecursiveDeref((DdManager *)bF_local,bRes1);
      Cudd_RecursiveDeref((DdManager *)bF_local,bRes);
      if (bF0->ref != 1) {
        st__insert((st__table *)pVar2Form_local,(char *)pCache_local,(char *)pDStack_70);
      }
      Cudd_Deref(&pDStack_70->sentinel);
      dd_local = pDStack_70;
    }
    else {
      dd_local = pDStack_70;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * Extra_dsdRemap( DdManager * dd, DdNode * bF, st__table * pCache,
    int * pVar2Form, int * pForm2Var, DdNode * pbCube0[], DdNode * pbCube1[] )
{
    DdNode * bFR, * bF0, * bF1;
    DdNode * bRes0, * bRes1, * bRes;
    int iForm;
    
    bFR = Cudd_Regular(bF);
    if ( cuddIsConstant(bFR) )
        return bF;

    // check the hash-table
    if ( bFR->ref != 1 )
    {
        if ( st__lookup( pCache, (char *)bF, (char **)&bRes ) )
            return bRes;
    }

    // get the formal input
    iForm = pVar2Form[bFR->index];

    // get the nodes pointed to by the cube
    bF0 = Extra_bddNodePointedByCube( dd, bF, pbCube0[iForm] );
    bF1 = Extra_bddNodePointedByCube( dd, bF, pbCube1[iForm] );

    // call recursively for these nodes
    bRes0 = Extra_dsdRemap( dd, bF0, pCache, pVar2Form, pForm2Var, pbCube0, pbCube1 ); Cudd_Ref( bRes0 );
    bRes1 = Extra_dsdRemap( dd, bF1, pCache, pVar2Form, pForm2Var, pbCube0, pbCube1 ); Cudd_Ref( bRes1 );

    // derive the result using ITE
    bRes = Cudd_bddIte( dd, dd->vars[ pForm2Var[iForm] ], bRes1, bRes0 ); Cudd_Ref( bRes );
    Cudd_RecursiveDeref( dd, bRes0 );
    Cudd_RecursiveDeref( dd, bRes1 );

    // add to the hash table
    if ( bFR->ref != 1 )
        st__insert( pCache, (char *)bF, (char *)bRes );
    Cudd_Deref( bRes );
    return bRes;
}